

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiColumns *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *columns;
  ImGuiColumnsFlags flags;
  ImGuiWindow *window;
  bool border_local;
  char *id_local;
  int columns_count_local;
  
  pIVar2 = GetCurrentWindow();
  if (0 < columns_count) {
    pIVar1 = (pIVar2->DC).CurrentColumns;
    if (((pIVar1 == (ImGuiColumns *)0x0) || (pIVar1->Count != columns_count)) ||
       (pIVar1->Flags != (uint)!border)) {
      if (pIVar1 != (ImGuiColumns *)0x0) {
        EndColumns();
      }
      if (columns_count != 1) {
        BeginColumns(id,columns_count,(uint)!border);
      }
    }
    return;
  }
  __assert_fail("columns_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                ,0x1d72,"void ImGui::Columns(int, const char *, bool)");
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiColumnsFlags flags = (border ? 0 : ImGuiColumnsFlags_NoBorder);
    //flags |= ImGuiColumnsFlags_NoPreserveWidths; // NB: Legacy behavior
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns != NULL && columns->Count == columns_count && columns->Flags == flags)
        return;

    if (columns != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}